

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinput_conversion.cpp
# Opt level: O0

void skiwi::anon_unknown_26::read_c_input
               (cinput_data *cinput,Expression *expr,environment_map *env,repl_data *rd)

{
  uint64_t uVar1;
  environment_entry e;
  environment_entry e_00;
  bool bVar2;
  FunCall *pFVar3;
  const_reference __v;
  variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  *__v_00;
  iterator __first;
  iterator __last;
  reference __rhs;
  string *psVar4;
  element_type *peVar5;
  element_type *peVar6;
  cinput_type local_24c;
  undefined8 local_248;
  undefined1 auStack_240 [28];
  undefined4 uStack_224;
  environment_entry ne_1;
  undefined1 local_1e0 [8];
  string newname_1;
  string name_1;
  undefined1 auStack_170 [8];
  environment_entry ne;
  undefined1 local_128 [8];
  string newname;
  string name;
  variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int> p;
  iterator __end2;
  iterator __begin2;
  vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
  *__range2;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> alpha_env;
  undefined1 local_90 [8];
  vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
  parsed;
  undefined1 local_58 [8];
  vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
  tokens;
  String *s;
  Literal *lit;
  Expression *pars;
  repl_data *rd_local;
  environment_map *env_local;
  Expression *expr_local;
  cinput_data *cinput_local;
  
  pFVar3 = std::
           get<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (expr);
  __v = std::
        vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
        ::front(&pFVar3->arguments);
  __v_00 = std::
           get<std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (__v);
  tokens.
  super__Vector_base<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                get<skiwi::String,skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
                          (__v_00);
  c_tokenize((vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
              *)local_58,
             &((String *)
              tokens.
              super__Vector_base<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->value);
  __first = std::
            vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
            ::begin((vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
                     *)local_58);
  __last = std::
           vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
           ::end((vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
                  *)local_58);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::(anonymous_namespace)::c_token*,std::vector<skiwi::(anonymous_namespace)::c_token,std::allocator<skiwi::(anonymous_namespace)::c_token>>>>
            ((__normal_iterator<skiwi::(anonymous_namespace)::c_token_*,_std::vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>_>
              )__first._M_current,
             (__normal_iterator<skiwi::(anonymous_namespace)::c_token_*,_std::vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>_>
              )__last._M_current);
  read_parameters((vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
                   *)local_90,
                  (vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
                   *)local_58);
  bVar2 = std::
          vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
          ::empty((vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
                   *)local_90);
  if (bVar2) {
    alpha_env.
    super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 1;
  }
  else {
    std::
    make_shared<skiwi::environment<skiwi::alpha_conversion_data>,std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>>&>
              ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&__range2);
    __end2 = std::
             vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
             ::begin((vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
                      *)local_90);
    p.super__Variant_base<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
    .
    super__Move_assign_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
    .
    super__Copy_assign_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
    .
    super__Move_ctor_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
    .
    super__Copy_ctor_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
    .
    super__Variant_storage_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
    ._32_8_ = std::
              vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
              ::end((vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
                     *)local_90);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_*,_std::vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>_>
                                       *)((long)&p.
                                                 super__Variant_base<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                                                 .
                                                 super__Move_assign_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                                                 .
                                                 super__Copy_assign_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                                                 .
                                                 super__Move_ctor_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                                                 .
                                                 super__Copy_ctor_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                                                 .
                                                 super__Variant_storage_alias<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                                         + 0x20)), bVar2) {
      __rhs = __gnu_cxx::
              __normal_iterator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_*,_std::vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>_>
              ::operator*(&__end2);
      std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>::
      variant((variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int> *)
              ((long)&name.field_2 + 8),__rhs);
      bVar2 = std::
              holds_alternative<skiwi::(anonymous_namespace)::c_int,skiwi::(anonymous_namespace)::c_real,skiwi::(anonymous_namespace)::c_int>
                        ((variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                          *)((long)&name.field_2 + 8));
      if (bVar2) {
        psVar4 = (string *)
                 std::
                 get<skiwi::(anonymous_namespace)::c_int,skiwi::(anonymous_namespace)::c_real,skiwi::(anonymous_namespace)::c_int>
                           ((variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                             *)((long)&name.field_2 + 8));
        std::__cxx11::string::string((string *)(newname.field_2._M_local_buf + 8),psVar4);
        uVar1 = rd->alpha_conversion_index;
        rd->alpha_conversion_index = uVar1 + 1;
        make_name((string *)local_128,(string *)((long)&newname.field_2 + 8),uVar1);
        peVar5 = std::
                 __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&__range2);
        alpha_conversion_data::alpha_conversion_data
                  ((alpha_conversion_data *)&ne.live_range.last,(string *)local_128);
        environment<skiwi::alpha_conversion_data>::push
                  (peVar5,(string *)((long)&newname.field_2 + 8),
                   (alpha_conversion_data *)&ne.live_range.last);
        alpha_conversion_data::~alpha_conversion_data((alpha_conversion_data *)&ne.live_range.last);
        environment_entry::environment_entry((environment_entry *)auStack_170);
        auStack_170._0_4_ = st_global;
        ne._0_8_ = rd->global_index << 3;
        rd->global_index = rd->global_index + 1;
        peVar6 = std::
                 __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)env);
        e._4_4_ = auStack_170._4_4_;
        e.st = auStack_170._0_4_;
        e.pos = ne._0_8_;
        e.live_range.first = ne.pos;
        e.live_range.last = ne.live_range.first;
        environment<skiwi::environment_entry>::push(peVar6,(string *)local_128,e);
        name_1.field_2._12_4_ = 1;
        std::
        vector<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>,std::allocator<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>>>
        ::emplace_back<std::__cxx11::string&,skiwi::cinput_data::cinput_type>
                  ((vector<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>,std::allocator<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>>>
                    *)cinput,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   (cinput_type *)(name_1.field_2._M_local_buf + 0xc));
        std::__cxx11::string::~string((string *)local_128);
        std::__cxx11::string::~string((string *)(newname.field_2._M_local_buf + 8));
      }
      else {
        bVar2 = std::
                holds_alternative<skiwi::(anonymous_namespace)::c_real,skiwi::(anonymous_namespace)::c_real,skiwi::(anonymous_namespace)::c_int>
                          ((variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                            *)((long)&name.field_2 + 8));
        if (bVar2) {
          psVar4 = (string *)
                   std::
                   get<skiwi::(anonymous_namespace)::c_real,skiwi::(anonymous_namespace)::c_real,skiwi::(anonymous_namespace)::c_int>
                             ((variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>
                               *)((long)&name.field_2 + 8));
          std::__cxx11::string::string((string *)(newname_1.field_2._M_local_buf + 8),psVar4);
          uVar1 = rd->alpha_conversion_index;
          rd->alpha_conversion_index = uVar1 + 1;
          make_name((string *)local_1e0,(string *)((long)&newname_1.field_2 + 8),uVar1);
          peVar5 = std::
                   __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&__range2);
          alpha_conversion_data::alpha_conversion_data
                    ((alpha_conversion_data *)&ne_1.live_range.last,(string *)local_1e0);
          environment<skiwi::alpha_conversion_data>::push
                    (peVar5,(string *)((long)&newname_1.field_2 + 8),
                     (alpha_conversion_data *)&ne_1.live_range.last);
          alpha_conversion_data::~alpha_conversion_data
                    ((alpha_conversion_data *)&ne_1.live_range.last);
          environment_entry::environment_entry((environment_entry *)(auStack_240 + 0x18));
          auStack_240._24_4_ = 2;
          ne_1._0_8_ = rd->global_index << 3;
          rd->global_index = rd->global_index + 1;
          peVar6 = std::
                   __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)env);
          local_248 = CONCAT44(uStack_224,auStack_240._24_4_);
          auStack_240._8_8_ = ne_1.pos;
          auStack_240._16_8_ = ne_1.live_range.first;
          auStack_240._0_8_ = ne_1._0_8_;
          e_00.pos = ne_1._0_8_;
          e_00._0_8_ = local_248;
          e_00.live_range.first = ne_1.pos;
          e_00.live_range.last = ne_1.live_range.first;
          environment<skiwi::environment_entry>::push(peVar6,(string *)local_1e0,e_00);
          local_24c = cin_double;
          std::
          vector<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>,std::allocator<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>>>
          ::emplace_back<std::__cxx11::string&,skiwi::cinput_data::cinput_type>
                    ((vector<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>,std::allocator<std::pair<std::__cxx11::string,skiwi::cinput_data::cinput_type>>>
                      *)cinput,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_24c);
          std::__cxx11::string::~string((string *)local_1e0);
          std::__cxx11::string::~string((string *)(newname_1.field_2._M_local_buf + 8));
        }
      }
      std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>::
      ~variant((variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int> *
               )((long)&name.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_*,_std::vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>_>
      ::operator++(&__end2);
    }
    std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::operator=
              (&rd->alpha_conversion_env,
               (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&__range2);
    std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::~shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&__range2);
    alpha_env.
    super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
  }
  std::
  vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
  ::~vector((vector<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>,_std::allocator<std::variant<skiwi::(anonymous_namespace)::c_real,_skiwi::(anonymous_namespace)::c_int>_>_>
             *)local_90);
  std::
  vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
  ::~vector((vector<skiwi::(anonymous_namespace)::c_token,_std::allocator<skiwi::(anonymous_namespace)::c_token>_>
             *)local_58);
  return;
}

Assistant:

void read_c_input(cinput_data& cinput, const Expression& expr, environment_map& env, repl_data& rd)
    {
    const Expression& pars = std::get<FunCall>(expr).arguments.front();
    const Literal& lit = std::get<Literal>(pars);
    const String& s = std::get<String>(lit);
    auto tokens = c_tokenize(s.value);
    std::reverse(tokens.begin(), tokens.end());
    auto parsed = read_parameters(tokens);
    
    if (parsed.empty())
      return;
    
    std::shared_ptr < environment<alpha_conversion_data>> alpha_env = std::make_shared<environment<alpha_conversion_data>>(rd.alpha_conversion_env);

    for (const auto p : parsed)
      {
      if (std::holds_alternative<c_int>(p))
        {
        std::string name = std::get<c_int>(p).name;
        std::string newname = make_name(name, rd.alpha_conversion_index++);
        alpha_env->push(name, newname);
        environment_entry ne;
        ne.st = environment_entry::st_global;
        ne.pos = rd.global_index * 8;
        ++(rd.global_index);
        env->push(newname, ne);
        cinput.parameters.emplace_back(newname, cinput_data::cin_int);
        }
      else if (std::holds_alternative<c_real>(p))
        {
        std::string name = std::get<c_real>(p).name;
        std::string newname = make_name(name, rd.alpha_conversion_index++);
        alpha_env->push(name, newname);
        environment_entry ne;
        ne.st = environment_entry::st_global;
        ne.pos = rd.global_index * 8;
        ++(rd.global_index);
        env->push(newname, ne);
        cinput.parameters.emplace_back(newname, cinput_data::cin_double);
        }
      }
    rd.alpha_conversion_env = alpha_env;
    }